

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
       ::
       cast<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>>
                 (vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  iterator src_00;
  iterator iVar2;
  PyObject **ppPVar3;
  undefined8 in_RDX;
  return_value_policy in_SIL;
  PyObject *in_RDI;
  object value_;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *value;
  iterator __end0;
  iterator __begin0;
  vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  *__range3;
  size_t index;
  list l;
  vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
  *in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  list *in_stack_ffffffffffffff70;
  handle local_88;
  uint local_7c;
  undefined8 local_78;
  PyObject *local_60;
  handle local_58;
  reference local_50;
  handle parent_00;
  long local_30;
  handle local_28;
  return_value_policy local_19;
  PyObject *local_18;
  undefined8 local_10;
  handle local_8;
  
  local_18 = in_RDI;
  local_10 = in_RDX;
  local_19 = return_value_policy_override<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_void>
             ::policy(in_SIL);
  std::
  vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
  ::size((vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
          *)local_18);
  list::list(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_30 = 0;
  src_00 = std::
           vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
           ::begin(in_stack_ffffffffffffff48);
  iVar2 = std::
          vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
          ::end(in_stack_ffffffffffffff48);
  parent_00.m_ptr = local_18;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
               ::operator*((__normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
                            *)&stack0xffffffffffffffc0);
    forward_like<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>&>
              (local_50);
    local_78 = local_10;
    local_60 = (PyObject *)
               set_caster<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long>
               ::
               cast<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                         (src_00._M_current,(return_value_policy)((ulong)iVar2._M_current >> 0x38),
                          parent_00);
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff58);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if (bVar1) {
      local_88 = object::release((object *)in_stack_ffffffffffffff48);
      ppPVar3 = pybind11::handle::ptr(&local_88);
      in_stack_ffffffffffffff58.m_ptr = *ppPVar3;
      ppPVar3 = pybind11::handle::ptr(&local_28);
      (&(((*ppPVar3)[1].ob_type)->ob_base).ob_base.ob_refcnt)[local_30] =
           (Py_ssize_t)in_stack_ffffffffffffff58.m_ptr;
      local_30 = local_30 + 1;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
    }
    local_7c = (uint)!bVar1;
    object::~object((object *)0x3de4bf);
    if (local_7c != 0) goto LAB_003de51d;
    __gnu_cxx::
    __normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
    ::operator++((__normal_iterator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_*,_std::vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  local_8 = object::release((object *)in_stack_ffffffffffffff48);
  local_7c = 1;
LAB_003de51d:
  list::~list((list *)0x3de52a);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }